

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void evaluate(char **argv)

{
  size_t i;
  ulong uVar1;
  CCELossNode *loss;
  MNIST *mnist;
  Model model;
  path local_658;
  ifstream params_file;
  ifstream labels;
  ifstream images;
  
  puts("Executing evaluation routine");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&params_file,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            ((path *)&model,(char (*) [23])"t10k-images-idx3-ubyte",auto_format);
  std::filesystem::__cxx11::operator/((path *)&labels,(path *)&params_file,(path *)&model);
  std::ifstream::ifstream(&images,_labels,_S_bin);
  std::filesystem::__cxx11::path::~path((path *)&labels);
  std::filesystem::__cxx11::path::~path((path *)&model);
  std::filesystem::__cxx11::path::~path((path *)&params_file);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&model,argv,auto_format);
  std::filesystem::__cxx11::path::path<char[23],std::filesystem::__cxx11::path>
            (&local_658,(char (*) [23])"t10k-labels-idx1-ubyte",auto_format);
  std::filesystem::__cxx11::operator/((path *)&params_file,(path *)&model,&local_658);
  std::ifstream::ifstream(&labels,_params_file,_S_bin);
  std::filesystem::__cxx11::path::~path((path *)&params_file);
  std::filesystem::__cxx11::path::~path(&local_658);
  std::filesystem::__cxx11::path::~path((path *)&model);
  create_model(&model,&images,&labels,&mnist,&loss);
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_658,argv + 1,auto_format);
  std::ifstream::ifstream(&params_file,local_658._M_pathname._M_dataplus._M_p,_S_bin);
  std::filesystem::__cxx11::path::~path(&local_658);
  Model::load(&model,&params_file);
  for (uVar1 = 0; uVar1 != mnist->image_count_; uVar1 = uVar1 + 1) {
    (*(mnist->super_Node)._vptr_Node[3])(mnist,0);
  }
  (*(loss->super_Node)._vptr_Node[8])();
  std::ifstream::~ifstream(&params_file);
  Model::~Model(&model);
  std::ifstream::~ifstream(&labels);
  std::ifstream::~ifstream(&images);
  return;
}

Assistant:

void evaluate(char* argv[])
{
    std::printf("Executing evaluation routine\n");

    std::ifstream images{
        std::filesystem::path{argv[0]} / "t10k-images-idx3-ubyte",
        std::ios::binary};

    std::ifstream labels{
        std::filesystem::path{argv[0]} / "t10k-labels-idx1-ubyte",
        std::ios::binary};

    MNIST* mnist;
    CCELossNode* loss;
    // For the data to be loaded properly, the model must be constructed in the
    // same manner as it was constructed during training.
    Model model = create_model(images, labels, &mnist, &loss);

    // Instead of initializing the parameters randomly, here we load it from
    // disk (saved from a previous training run).
    std::ifstream params_file{std::filesystem::path{argv[1]}, std::ios::binary};
    model.load(params_file);

    // Evaluate all 10000 images in the test set and compute the loss average
    for (size_t i = 0; i != mnist->size(); ++i)
    {
        mnist->forward();
    }
    loss->print();
}